

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_expression.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::
jsonpath_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::evaluate(jsonpath_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
           *this,const_reference root,result_options options)

{
  result_options in_ECX;
  undefined4 in_register_00000014;
  path_node_type *path;
  undefined8 extraout_RDX;
  value_type *result;
  value_type vVar1;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  context;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  local_e8;
  anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_58;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  path = (path_node_type *)CONCAT44(in_register_00000014,options);
  if ((in_ECX & path) == value) {
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::eval_context(&local_e8,(allocator_type *)root);
    local_58._0_8_ = 0;
    local_58.int64_.val_ = 1;
    local_48 = 0;
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    detail::
    path_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::evaluate((path_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                *)this,(eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                        *)(root + 1),(reference)&local_e8,path,(reference)&local_58.common_,options)
    ;
  }
  else {
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::eval_context(&local_e8,(allocator_type *)root);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,0,root);
    local_58._0_8_ = 0;
    local_58.int64_.val_ = 1;
    local_48 = 0;
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    detail::
    path_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
    ::
    evaluate<jsoncons::jsonpath::jsonpath_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::evaluate(jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::jsonpath::result_options)const::_lambda(jsoncons::jsonpath::basic_path_node<wchar_t>const&,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&)_1_>
              ((path_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                *)(root + 1),&local_e8,(reference)path,(path_node_type *)&local_58.common_,
               (reference)path,(anon_class_8_1_6971b95b)this,in_ECX);
  }
  detail::
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~eval_context(&local_e8);
  vVar1.field_0.int64_.val_ = extraout_RDX;
  vVar1.field_0._0_8_ = this;
  return (value_type)vVar1.field_0;
}

Assistant:

value_type evaluate(const_reference root, result_options options = result_options()) const
        {
            if ((options & result_options::path) == result_options::path)
            {
                jsoncons::jsonpath::detail::eval_context<value_type, const_reference> context{ alloc_ };

                value_type result(json_array_arg, semantic_tag::none, alloc_);
                auto callback = [&result](const path_node_type& p, const_reference)
                {
                    result.emplace_back(to_basic_string(p));
                };
                const_expr_.evaluate(context, root, path_node_type{}, root, callback, options);
                return result;
            }
            jsoncons::jsonpath::detail::eval_context<value_type, const_reference> context{ alloc_ };
            return const_expr_.evaluate(context, root, path_node_type{}, root, options);
        }